

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O1

void __thiscall
flatbuffers::BinaryAnnotator::BuildString
          (BinaryAnnotator *this,uint64_t string_offset,Object *table,Field *field)

{
  Field *pFVar1;
  bool bVar2;
  ushort uVar3;
  long *plVar4;
  Field *pFVar5;
  long *plVar6;
  size_type *psVar7;
  uint64_t uVar8;
  _Alloc_hider _Var9;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  BinaryRegionComment string_length_comment;
  BinaryRegionComment string_terminator_comment;
  BinaryRegionComment string_comment;
  allocator<char> local_539;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_538;
  Field *local_518;
  BinaryAnnotator *local_510;
  BinaryRegionStatus local_508;
  undefined1 *local_500;
  long local_4f8;
  undefined1 local_4f0;
  undefined7 uStack_4ef;
  BinaryRegionCommentType local_4e0;
  undefined1 *local_4d8;
  long local_4d0;
  undefined1 local_4c8;
  undefined7 uStack_4c7;
  undefined1 *local_4b8;
  long local_4b0;
  undefined1 local_4a8;
  undefined7 uStack_4a7;
  size_t local_498;
  undefined1 local_490 [40];
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  _Alloc_hider local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  _Alloc_hider local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  undefined8 local_3f0;
  ulong *local_3e8;
  long local_3e0;
  ulong auStack_3d8 [2];
  BinaryRegionCommentType local_3c8;
  undefined1 *local_3c0;
  long local_3b8;
  undefined1 local_3b0;
  undefined7 uStack_3af;
  undefined1 *local_3a0;
  long local_398;
  undefined1 local_390;
  undefined7 uStack_38f;
  size_t local_380;
  undefined1 local_378 [40];
  BinaryRegionCommentType local_350;
  undefined1 *local_348;
  long local_340;
  undefined1 local_338;
  undefined7 uStack_337;
  undefined1 *local_328;
  long local_320;
  undefined1 local_318;
  undefined7 uStack_317;
  size_t local_308;
  long *local_300 [2];
  long local_2f0 [2];
  long *local_2e0 [2];
  long local_2d0 [2];
  undefined1 local_2c0 [8];
  _Alloc_hider local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  BinaryRegionCommentType local_298;
  _Alloc_hider local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  size_t local_250;
  long *local_248 [2];
  long local_238 [2];
  undefined1 local_228 [8];
  _Alloc_hider local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  BinaryRegionCommentType local_200;
  _Alloc_hider local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  size_t local_1b8;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  BinaryRegionCommentType local_188;
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  _Alloc_hider local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  size_t local_140;
  undefined1 local_138 [8];
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  BinaryRegionCommentType local_110;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  size_t local_c8;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  BinaryRegionCommentType local_98;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  size_t local_50;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_48;
  
  bVar2 = ContainsSection(this,string_offset);
  if (bVar2) {
    return;
  }
  local_538.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_538.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_538.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar1 = (Field *)this->binary_length_;
  if (pFVar1 <= (Field *)(string_offset + 3) || pFVar1 < (Field *)0x5) {
    uVar8 = 0;
  }
  else {
    uVar8 = (uint64_t)*(uint *)(this->binary_ + string_offset);
  }
  local_508 = OK;
  local_500 = &local_4f0;
  local_4f8 = 0;
  local_4f0 = 0;
  local_4d8 = &local_4c8;
  local_4d0 = 0;
  local_4c8 = 0;
  local_4b8 = &local_4a8;
  local_4b0 = 0;
  local_4a8 = 0;
  local_498 = 0;
  local_4e0 = StringLength;
  if (pFVar1 <= (Field *)(string_offset + 3) || pFVar1 < (Field *)0x5) {
    uVar8 = 0;
    if (string_offset <= pFVar1) {
      uVar8 = (long)pFVar1 - string_offset;
    }
    local_510 = this;
    local_2e0[0] = local_2d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"4","");
    local_508 = ERROR_INCOMPLETE_BINARY;
    std::__cxx11::string::_M_assign((string *)&local_500);
    if (local_2e0[0] != local_2d0) {
      operator_delete(local_2e0[0],local_2d0[0] + 1);
    }
    local_c0._0_4_ = local_508;
    local_b8._M_p = (pointer)&local_a8;
    local_518 = field;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_500,local_500 + local_4f8);
    local_98 = local_4e0;
    local_90._M_p = (pointer)&local_80;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_4d8,local_4d8 + local_4d0);
    local_70._M_p = (pointer)&local_60;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_4b8,local_4b8 + local_4b0);
    local_50 = local_498;
    anon_unknown_49::MakeBinaryRegion
              ((BinaryRegion *)local_490,string_offset,uVar8,Unknown,uVar8,0,
               (BinaryRegionComment *)local_c0);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
    emplace_back<flatbuffers::BinaryRegion>(&local_538,(BinaryRegion *)local_490);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_p != &local_408) {
      operator_delete(local_418._M_p,local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_p != &local_428) {
      operator_delete(local_438._M_p,local_428._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468.
           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
           ._M_impl.super__Vector_impl_data._M_finish != &local_450) {
      operator_delete(local_468.
                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_450._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    this = local_510;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    _Var9._M_p = local_b8._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p == &local_a8) goto LAB_00312d7a;
  }
  else {
    pFVar5 = (Field *)(uVar8 + string_offset + 4);
    if (pFVar5 < pFVar1) {
      local_2c0._0_4_ = OK;
      local_2b8._M_p = (pointer)&local_2a8;
      local_518 = pFVar5;
      std::__cxx11::string::_M_construct<char*>((string *)&local_2b8,local_500,local_500);
      local_298 = local_4e0;
      local_290._M_p = (pointer)&local_280;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_290,local_4d8,local_4d8 + local_4d0);
      local_270._M_p = (pointer)&local_260;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,local_4b8,local_4b8 + local_4b0);
      local_250 = local_498;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_490,string_offset,4,Uint32,0,0,
                 (BinaryRegionComment *)local_2c0);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>(&local_538,(BinaryRegion *)local_490);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_p != &local_408) {
        operator_delete(local_418._M_p,local_408._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_p != &local_428) {
        operator_delete(local_438._M_p,local_428._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish != &local_450) {
        operator_delete(local_468.
                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        local_450._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_p != &local_260) {
        operator_delete(local_270._M_p,local_260._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_p != &local_280) {
        operator_delete(local_290._M_p,local_280._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_p != &local_2a8) {
        operator_delete(local_2b8._M_p,local_2a8._M_allocated_capacity + 1);
      }
      local_378._8_8_ = local_378 + 0x18;
      local_378._0_8_ = (ulong)(uint)local_378._4_4_ << 0x20;
      local_378._16_8_ = 0;
      local_378._24_8_ = local_378._24_8_ & 0xffffffffffffff00;
      local_348 = &local_338;
      local_340 = 0;
      local_338 = 0;
      local_328 = &local_318;
      local_320 = 0;
      local_318 = 0;
      local_308 = 0;
      local_350 = StringValue;
      local_138._0_4_ = OK;
      local_130._M_p = (pointer)&local_120;
      std::__cxx11::string::_M_construct<char*>((string *)&local_130,local_378._8_8_);
      local_110 = local_350;
      local_108._M_p = (pointer)&local_f8;
      local_510 = this;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,local_348,local_348 + local_340);
      local_e8._M_p = (pointer)&local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_328,local_328 + local_320)
      ;
      local_c8 = local_308;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_490,string_offset + 4,uVar8,Char,uVar8,0,
                 (BinaryRegionComment *)local_138);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>(&local_538,(BinaryRegion *)local_490);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_p != &local_408) {
        operator_delete(local_418._M_p,local_408._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_p != &local_428) {
        operator_delete(local_438._M_p,local_428._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish != &local_450) {
        operator_delete(local_468.
                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        local_450._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_p != &local_d8) {
        operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_p != &local_120) {
        operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
      }
      local_3e8 = auStack_3d8;
      local_3f0 = (long *)((ulong)local_3f0._4_4_ << 0x20);
      local_3e0 = 0;
      auStack_3d8[0] = auStack_3d8[0] & 0xffffffffffffff00;
      local_3c0 = &local_3b0;
      local_3b8 = 0;
      local_3b0 = 0;
      local_398 = 0;
      local_390 = 0;
      local_380 = 0;
      local_3c8 = StringTerminator;
      local_228._0_4_ = OK;
      local_220._M_p = (pointer)&local_210;
      local_3a0 = &local_390;
      std::__cxx11::string::_M_construct<char*>((string *)&local_220,local_3e8);
      local_200 = local_3c8;
      local_1f8._M_p = (pointer)&local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_3c0,local_3c0 + local_3b8);
      local_1d8._M_p = (pointer)&local_1c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,local_3a0,local_3a0 + local_398);
      local_1b8 = local_380;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_490,(uint64_t)local_518,1,Char,0,0,
                 (BinaryRegionComment *)local_228);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>(&local_538,(BinaryRegion *)local_490);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_p != &local_408) {
        operator_delete(local_418._M_p,local_408._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_p != &local_428) {
        operator_delete(local_438._M_p,local_428._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish != &local_450) {
        operator_delete(local_468.
                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        local_450._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_p != &local_1c8) {
        operator_delete(local_1d8._M_p,local_1c8._M_allocated_capacity + 1);
      }
      this = local_510;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_p != &local_1e8) {
        operator_delete(local_1f8._M_p,local_1e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_p != &local_210) {
        operator_delete(local_220._M_p,local_210._M_allocated_capacity + 1);
      }
      if (local_3a0 != &local_390) {
        operator_delete(local_3a0,CONCAT71(uStack_38f,local_390) + 1);
      }
      if (local_3c0 != &local_3b0) {
        operator_delete(local_3c0,CONCAT71(uStack_3af,local_3b0) + 1);
      }
      if (local_3e8 != auStack_3d8) {
        operator_delete(local_3e8,auStack_3d8[0] + 1);
      }
      if (local_328 != &local_318) {
        operator_delete(local_328,CONCAT71(uStack_317,local_318) + 1);
      }
      if (local_348 != &local_338) {
        operator_delete(local_348,CONCAT71(uStack_337,local_338) + 1);
      }
      local_a8._M_allocated_capacity = local_378._24_8_;
      _Var9._M_p = (pointer)local_378._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._8_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_378 + 0x18)) goto LAB_00312d7a;
    }
    else {
      local_300[0] = local_2f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"");
      local_508 = ERROR_LENGTH_TOO_LONG;
      std::__cxx11::string::_M_assign((string *)&local_500);
      if (local_300[0] != local_2f0) {
        operator_delete(local_300[0],local_2f0[0] + 1);
      }
      local_1b0._0_4_ = local_508;
      local_1a8._M_p = (pointer)&local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,local_500,local_500 + local_4f8);
      local_188 = local_4e0;
      local_180._M_p = (pointer)&local_170;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_180,local_4d8,local_4d8 + local_4d0);
      local_160._M_p = (pointer)&local_150;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,local_4b8,local_4b8 + local_4b0);
      local_140 = local_498;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_490,string_offset,4,Uint32,0,0,
                 (BinaryRegionComment *)local_1b0);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>(&local_538,(BinaryRegion *)local_490);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_p != &local_408) {
        operator_delete(local_418._M_p,local_408._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_p != &local_428) {
        operator_delete(local_438._M_p,local_428._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish != &local_450) {
        operator_delete(local_468.
                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        local_450._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_p != &local_150) {
        operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_p != &local_170) {
        operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
      }
      local_a8._M_allocated_capacity = local_198._M_allocated_capacity;
      _Var9._M_p = local_1a8._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_p == &local_198) goto LAB_00312d7a;
    }
  }
  operator_delete(_Var9._M_p,local_a8._M_allocated_capacity + 1);
LAB_00312d7a:
  if (*(ushort *)(table + -(long)*(int *)table) < 5) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(ushort *)(table + (4 - (long)*(int *)table));
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_248,
             (char *)(table + (ulong)*(uint *)(table + uVar3) + (ulong)uVar3 + 4),&local_539);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_248);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_3e0 = *plVar6;
    auStack_3d8[0] = plVar4[3];
    local_3f0 = &local_3e0;
  }
  else {
    local_3e0 = *plVar6;
    local_3f0 = (long *)*plVar4;
  }
  local_3e8 = (ulong *)plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_3f0);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar7) {
    local_378._16_8_ = *psVar7;
    local_378._24_8_ = plVar4[3];
    local_378._0_8_ = local_378 + 0x10;
  }
  else {
    local_378._16_8_ = *psVar7;
    local_378._0_8_ = (size_type *)*plVar4;
  }
  local_378._8_8_ = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_48.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_538.
       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_538.
       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_538.
       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_538.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_538.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_538.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  anon_unknown_49::MakeBinarySection
            ((BinarySection *)local_490,(string *)local_378,String,&local_48);
  AddSection(this,string_offset,(BinarySection *)local_490);
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            (&local_468);
  if ((undefined1 *)local_490._0_8_ != local_490 + 0x10) {
    operator_delete((void *)local_490._0_8_,local_490._16_8_ + 1);
  }
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            (&local_48);
  if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
    operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
  }
  if (local_3f0 != &local_3e0) {
    operator_delete(local_3f0,local_3e0 + 1);
  }
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  if (local_4b8 != &local_4a8) {
    operator_delete(local_4b8,CONCAT71(uStack_4a7,local_4a8) + 1);
  }
  if (local_4d8 != &local_4c8) {
    operator_delete(local_4d8,CONCAT71(uStack_4c7,local_4c8) + 1);
  }
  if (local_500 != &local_4f0) {
    operator_delete(local_500,CONCAT71(uStack_4ef,local_4f0) + 1);
  }
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            (&local_538);
  return;
}

Assistant:

void BinaryAnnotator::BuildString(const uint64_t string_offset,
                                  const reflection::Object *const table,
                                  const reflection::Field *const field) {
  // Check if we have already generated this string section, and this is a
  // shared string instance.
  if (ContainsSection(string_offset)) { return; }

  std::vector<BinaryRegion> regions;
  const auto string_length = ReadScalar<uint32_t>(string_offset);

  BinaryRegionComment string_length_comment;
  string_length_comment.type = BinaryRegionCommentType::StringLength;

  if (!string_length.has_value()) {
    const uint64_t remaining = RemainingBytes(string_offset);

    SetError(string_length_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "4");

    regions.push_back(MakeBinaryRegion(string_offset, remaining,
                                       BinaryRegionType::Unknown, remaining, 0,
                                       string_length_comment));

  } else {
    const uint32_t string_size = string_length.value();
    const uint64_t string_end =
        string_offset + sizeof(uint32_t) + string_size + sizeof(char);

    if (!IsValidOffset(string_end - 1)) {
      SetError(string_length_comment,
               BinaryRegionStatus::ERROR_LENGTH_TOO_LONG);

      regions.push_back(MakeBinaryRegion(string_offset, sizeof(uint32_t),
                                         BinaryRegionType::Uint32, 0, 0,
                                         string_length_comment));
    } else {
      regions.push_back(MakeBinaryRegion(string_offset, sizeof(uint32_t),
                                         BinaryRegionType::Uint32, 0, 0,
                                         string_length_comment));

      BinaryRegionComment string_comment;
      string_comment.type = BinaryRegionCommentType::StringValue;

      regions.push_back(MakeBinaryRegion(string_offset + sizeof(uint32_t),
                                         string_size, BinaryRegionType::Char,
                                         string_size, 0, string_comment));

      BinaryRegionComment string_terminator_comment;
      string_terminator_comment.type =
          BinaryRegionCommentType::StringTerminator;

      regions.push_back(MakeBinaryRegion(
          string_offset + sizeof(uint32_t) + string_size, sizeof(char),
          BinaryRegionType::Char, 0, 0, string_terminator_comment));
    }
  }

  AddSection(string_offset,
             MakeBinarySection(std::string(table->name()->c_str()) + "." +
                                   field->name()->c_str(),
                               BinarySectionType::String, std::move(regions)));
}